

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::shortStringReplacement_abi_cxx11_(string *__return_storage_ptr__,units *this,char U)

{
  char cVar1;
  int iVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 local_59d;
  undefined1 local_59c;
  undefined1 local_59b;
  char local_59a [34];
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_500;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_488;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  cVar1 = (char)this;
  if ((shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&shortStringReplacement[abi:cxx11](char)::
                                   singleCharUnitStrings_abi_cxx11_), iVar2 != 0)) {
    local_59a[0x21] = 0x6d;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_578,local_59a + 0x21,(char (*) [6])0x40031b);
    local_59a[0x20] = 0x73;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(&local_550,local_59a + 0x20,(char (*) [7])0x3fc792);
    local_59a[0x1f] = 0x53;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[8],_true>(&local_528,local_59a + 0x1f,(char (*) [8])"siemens");
    local_59a[0x1e] = 0x6c;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_500,local_59a + 0x1e,(char (*) [6])0x3fbb3c);
    local_59a[0x1d] = 0x67;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_4d8,local_59a + 0x1d,(char (*) [5])0x3fd35b);
    local_59a[0x1c] = 0x62;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_4b0,local_59a + 0x1c,(char (*) [5])"barn");
    local_59a[0x1b] = 0x72;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[12],_true>(&local_488,local_59a + 0x1b,(char (*) [12])"revolutions")
    ;
    local_59a[0x1a] = 0x56;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_460,local_59a + 0x1a,(char (*) [5])0x3fd6d4);
    local_59a[0x19] = 0x46;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_438,local_59a + 0x19,(char (*) [6])0x3fc33d);
    local_59a[0x18] = 0x79;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_410,local_59a + 0x18,(char (*) [5])0x3e7125);
    local_59a[0x17] = 0x70;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_3e8,local_59a + 0x17,(char (*) [6])"poise");
    local_59a[0x16] = 0x4b;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(&local_3c0,local_59a + 0x16,(char (*) [7])0x3fc2af);
    local_59a[0x15] = 0x61;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>(&local_398,local_59a + 0x15,(char (*) [4])0x3fcea1);
    local_59a[0x14] = 0x4e;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(&local_370,local_59a + 0x14,(char (*) [7])"newton");
    local_59a[0x13] = 100;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>(&local_348,local_59a + 0x13,(char (*) [4])0x3fb97e);
    local_59a[0x12] = 0x42;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_320,local_59a + 0x12,(char (*) [5])0x3f282b);
    local_59a[0x11] = 0x58;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[3],_true>(&local_2f8,local_59a + 0x11,(char (*) [3])"xu");
    local_59a[0x10] = 0x54;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_2d0,local_59a + 0x10,(char (*) [6])"tesla");
    local_59a[0xf] = 0x55;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_2a8,local_59a + 0xf,(char (*) [6])0x3d32a4);
    local_59a[0xe] = 0x4d;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_280,local_59a + 0xe,(char (*) [6])"molar");
    local_59a[0xd] = 0x50;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_258,local_59a + 0xd,(char (*) [6])"poise");
    local_59a[0xc] = 0x57;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_230,local_59a + 0xc,(char (*) [5])0x3fcec4);
    local_59a[0xb] = 0x41;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(&local_208,local_59a + 0xb,(char (*) [7])"ampere");
    local_59a[10] = 0x43;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[8],_true>(&local_1e0,local_59a + 10,(char (*) [8])0x3fcd0f);
    local_59a[9] = 0x4a;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_1b8,local_59a + 9,(char (*) [6])"joule");
    local_59a[8] = 0x48;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_190,local_59a + 8,(char (*) [6])0x3fc3d1);
    local_59a[7] = 0x47;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_168,local_59a + 7,(char (*) [6])"gauss");
    local_59a[6] = 0x68;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_140,local_59a + 6,(char (*) [5])0x3fee8e);
    local_59a[5] = 0x44;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>(&local_118,local_59a + 5,(char (*) [4])0x3fb97e);
    local_59a[4] = 0x6f;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(&local_f0,local_59a + 4,(char (*) [7])"arcdeg");
    local_59a[3] = 0x4c;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>(&local_c8,local_59a + 3,(char (*) [7])"liter ");
    local_59a[2] = 0x57;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>(&local_a0,local_59a + 2,(char (*) [5])0x3fcec4);
    local_59a[1] = 0x65;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[17],_true>
              (&local_78,local_59a + 1,(char (*) [17])"elementarycharge");
    local_59a[0] = 't';
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>(&local_50,local_59a,(char (*) [6])0x3fed9c);
    std::
    _Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<char_const,std::__cxx11::string>const*>
              ((_Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,
               &local_578,&stack0xffffffffffffffd8,0,&local_59b,&local_59c,&local_59d);
    lVar4 = -0x550;
    paVar7 = &local_50.second.field_2;
    do {
      if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar7->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                        paVar7->_M_allocated_capacity + 1);
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar7->_M_allocated_capacity + -5);
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0);
    __cxa_atexit(std::
                 unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~unordered_map,
                 &shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_);
  }
  p_Var5 = shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_._M_h._M_buckets
           [(ulong)(long)cVar1 %
            shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_._M_h.
            _M_bucket_count];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(char *)&p_Var5->_M_nxt[1]._M_nxt != cVar1)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(char *)&p_Var3[1]._M_nxt %
           shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_._M_h.
           _M_bucket_count !=
           (ulong)(long)cVar1 %
           shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_._M_h.
           _M_bucket_count) || (p_Var6 = p_Var5, *(char *)&p_Var3[1]._M_nxt == cVar1))
      goto LAB_003b685d;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_003b685d:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = cVar1;
    __return_storage_ptr__->_M_string_length = 1;
    (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var3[2]._M_nxt,
               (long)&(p_Var3[2]._M_nxt)->_M_nxt + (long)&(p_Var3[3]._M_nxt)->_M_nxt);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string shortStringReplacement(char U)
{
    // LCOV_EXCL_START
    // not sure why this isn't showing up as covered
    static const std::unordered_map<char, std::string> singleCharUnitStrings{
        {'m', "meter"},       {'s', "second"}, {'S', "siemens"},
        {'l', "liter"},       {'g', "gram"},   {'b', "barn"},
        {'r', "revolutions"}, {'V', "volt"},   {'F', "farad"},
        {'y', "year"},        {'p', "poise"},  {'K', "kelvin"},
        {'a', "are"},         {'N', "newton"}, {'d', "day"},
        {'B', "byte"},        {'X', "xu"},     {'T', "tesla"},
        {'U', "units"},       {'M', "molar"},  {'P', "poise"},
        {'W', "watt"},        {'A', "ampere"}, {'C', "coulomb"},
        {'J', "joule"},       {'H', "henry"},  {'G', "gauss"},
        {'h', "hour"},        {'D', "day"},    {'o', "arcdeg"},
        {'L', "liter "},      {'W', "watt"},   {'e', "elementarycharge"},
        {'t', "tonne"}};

    // LCOV_EXCL_STOP

    auto res = singleCharUnitStrings.find(U);
    return (res == singleCharUnitStrings.end()) ? std::string(1, U) :
                                                  res->second;
}